

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.c
# Opt level: O0

OPJ_BOOL opj_sparse_array_int32_read_or_write
                   (opj_sparse_array_int32_t *sa,OPJ_UINT32 x0,OPJ_UINT32 y0,OPJ_UINT32 x1,
                   OPJ_UINT32 y1,OPJ_INT32 *buf,OPJ_UINT32 buf_col_stride,OPJ_UINT32 buf_line_stride
                   ,OPJ_BOOL forgiving,OPJ_BOOL is_read_op)

{
  uint uVar1;
  OPJ_BOOL OVar2;
  uint uVar3;
  OPJ_UINT32 OVar4;
  uint uVar5;
  OPJ_UINT32 OVar6;
  OPJ_UINT32 local_d4;
  OPJ_UINT32 local_cc;
  uint local_c8;
  uint local_c4;
  OPJ_UINT32 k_5;
  OPJ_UINT32 k_4;
  OPJ_INT32 *src_ptr_2;
  OPJ_INT32 *dest_ptr_5;
  OPJ_INT32 *src_ptr_1;
  OPJ_INT32 *dest_ptr_4;
  uint local_98;
  OPJ_UINT32 k_3;
  OPJ_UINT32 k_2;
  OPJ_UINT32 k_1;
  OPJ_INT32 *dest_ptr_3;
  OPJ_INT32 *dest_ptr_2;
  OPJ_INT32 *src_ptr;
  OPJ_INT32 *pOStack_70;
  OPJ_UINT32 k;
  OPJ_INT32 *dest_ptr_1;
  OPJ_INT32 *dest_ptr;
  OPJ_INT32 *src_block;
  OPJ_UINT32 block_x_offset;
  OPJ_UINT32 j;
  OPJ_UINT32 block_y_offset;
  OPJ_UINT32 x_incr;
  OPJ_UINT32 block_x;
  OPJ_UINT32 x;
  OPJ_UINT32 block_width;
  OPJ_UINT32 y_incr;
  OPJ_UINT32 block_y;
  OPJ_UINT32 y;
  OPJ_INT32 *buf_local;
  OPJ_UINT32 y1_local;
  OPJ_UINT32 x1_local;
  OPJ_UINT32 y0_local;
  OPJ_UINT32 x0_local;
  opj_sparse_array_int32_t *sa_local;
  
  uVar1 = sa->block_width;
  OVar2 = opj_sparse_array_is_region_valid(sa,x0,y0,x1,y1);
  if (OVar2 == 0) {
    sa_local._4_4_ = forgiving;
  }
  else {
    block_width = y0 / sa->block_height;
    for (y_incr = y0; y_incr < y1; y_incr = OVar4 + y_incr) {
      if (y_incr == y0) {
        local_cc = sa->block_height - y0 % sa->block_height;
      }
      else {
        local_cc = sa->block_height;
      }
      uVar3 = sa->block_height - local_cc;
      OVar4 = opj_uint_min(local_cc,y1 - y_incr);
      block_y_offset = x0 / uVar1;
      for (x_incr = x0; x_incr < x1; x_incr = OVar6 + x_incr) {
        local_d4 = uVar1;
        if (x_incr == x0) {
          local_d4 = uVar1 - x0 % uVar1;
        }
        uVar5 = uVar1 - local_d4;
        OVar6 = opj_uint_min(local_d4,x1 - x_incr);
        dest_ptr = sa->data_blocks[block_width * sa->block_count_hor + block_y_offset];
        if (is_read_op == 0) {
          if (dest_ptr == (OPJ_INT32 *)0x0) {
            dest_ptr = (OPJ_INT32 *)opj_calloc(1,(ulong)(sa->block_width * sa->block_height) << 2);
            if (dest_ptr == (OPJ_INT32 *)0x0) {
              return 0;
            }
            sa->data_blocks[block_width * sa->block_count_hor + block_y_offset] = dest_ptr;
          }
          if (buf_col_stride == 1) {
            src_ptr_1 = dest_ptr + (ulong)uVar3 * (ulong)uVar1 + (ulong)uVar5;
            dest_ptr_5 = buf + (ulong)(y_incr - y0) * (ulong)buf_line_stride + (ulong)(x_incr - x0);
            if (OVar6 == 4) {
              for (src_block._4_4_ = 0; src_block._4_4_ < OVar4;
                  src_block._4_4_ = src_block._4_4_ + 1) {
                memcpy(src_ptr_1,dest_ptr_5,0x10);
                src_ptr_1 = src_ptr_1 + uVar1;
                dest_ptr_5 = dest_ptr_5 + buf_line_stride;
              }
            }
            else {
              for (src_block._4_4_ = 0; src_block._4_4_ < OVar4;
                  src_block._4_4_ = src_block._4_4_ + 1) {
                memcpy(src_ptr_1,dest_ptr_5,(ulong)OVar6 << 2);
                src_ptr_1 = src_ptr_1 + uVar1;
                dest_ptr_5 = dest_ptr_5 + buf_line_stride;
              }
            }
          }
          else {
            src_ptr_2 = dest_ptr + (ulong)uVar3 * (ulong)uVar1 + (ulong)uVar5;
            _k_5 = buf + (ulong)(y_incr - y0) * (ulong)buf_line_stride +
                         (ulong)((x_incr - x0) * buf_col_stride);
            if (OVar6 == 1) {
              for (src_block._4_4_ = 0; src_block._4_4_ < OVar4;
                  src_block._4_4_ = src_block._4_4_ + 1) {
                *src_ptr_2 = *_k_5;
                _k_5 = _k_5 + buf_line_stride;
                src_ptr_2 = src_ptr_2 + uVar1;
              }
            }
            else if ((OVar6 < 8) || (buf_col_stride != 8)) {
              for (src_block._4_4_ = 0; src_block._4_4_ < OVar4;
                  src_block._4_4_ = src_block._4_4_ + 1) {
                for (local_c8 = 0; local_c8 < OVar6; local_c8 = local_c8 + 1) {
                  src_ptr_2[local_c8] = _k_5[local_c8 * buf_col_stride];
                }
                _k_5 = _k_5 + buf_line_stride;
                src_ptr_2 = src_ptr_2 + uVar1;
              }
            }
            else {
              for (src_block._4_4_ = 0; src_block._4_4_ < OVar4;
                  src_block._4_4_ = src_block._4_4_ + 1) {
                for (local_c4 = 0; local_c4 < (OVar6 & 0xfffffffc); local_c4 = local_c4 + 4) {
                  src_ptr_2[local_c4] = _k_5[local_c4 * 8];
                  src_ptr_2[local_c4 + 1] = _k_5[(local_c4 + 1) * 8];
                  src_ptr_2[local_c4 + 2] = _k_5[(local_c4 + 2) * 8];
                  src_ptr_2[local_c4 + 3] = _k_5[(local_c4 + 3) * 8];
                }
                for (; local_c4 < OVar6; local_c4 = local_c4 + 1) {
                  src_ptr_2[local_c4] = _k_5[local_c4 * 8];
                }
                _k_5 = _k_5 + buf_line_stride;
                src_ptr_2 = src_ptr_2 + uVar1;
              }
            }
          }
        }
        else if (dest_ptr == (OPJ_INT32 *)0x0) {
          if (buf_col_stride == 1) {
            dest_ptr_1 = buf + (ulong)(y_incr - y0) * (ulong)buf_line_stride + (ulong)(x_incr - x0);
            for (src_block._4_4_ = 0; src_block._4_4_ < OVar4; src_block._4_4_ = src_block._4_4_ + 1
                ) {
              memset(dest_ptr_1,0,(ulong)OVar6 << 2);
              dest_ptr_1 = dest_ptr_1 + buf_line_stride;
            }
          }
          else {
            pOStack_70 = buf + (ulong)(y_incr - y0) * (ulong)buf_line_stride +
                               (ulong)((x_incr - x0) * buf_col_stride);
            for (src_block._4_4_ = 0; src_block._4_4_ < OVar4; src_block._4_4_ = src_block._4_4_ + 1
                ) {
              for (src_ptr._4_4_ = 0; src_ptr._4_4_ < OVar6; src_ptr._4_4_ = src_ptr._4_4_ + 1) {
                pOStack_70[src_ptr._4_4_ * buf_col_stride] = 0;
              }
              pOStack_70 = pOStack_70 + buf_line_stride;
            }
          }
        }
        else {
          dest_ptr_2 = dest_ptr + (ulong)uVar3 * (ulong)uVar1 + (ulong)uVar5;
          if (buf_col_stride == 1) {
            dest_ptr_3 = buf + (ulong)(y_incr - y0) * (ulong)buf_line_stride + (ulong)(x_incr - x0);
            if (OVar6 == 4) {
              for (src_block._4_4_ = 0; src_block._4_4_ < OVar4;
                  src_block._4_4_ = src_block._4_4_ + 1) {
                memcpy(dest_ptr_3,dest_ptr_2,0x10);
                dest_ptr_3 = dest_ptr_3 + buf_line_stride;
                dest_ptr_2 = dest_ptr_2 + uVar1;
              }
            }
            else {
              for (src_block._4_4_ = 0; src_block._4_4_ < OVar4;
                  src_block._4_4_ = src_block._4_4_ + 1) {
                memcpy(dest_ptr_3,dest_ptr_2,(ulong)OVar6 << 2);
                dest_ptr_3 = dest_ptr_3 + buf_line_stride;
                dest_ptr_2 = dest_ptr_2 + uVar1;
              }
            }
          }
          else {
            _k_2 = buf + (ulong)(y_incr - y0) * (ulong)buf_line_stride +
                         (ulong)((x_incr - x0) * buf_col_stride);
            if (OVar6 == 1) {
              for (src_block._4_4_ = 0; src_block._4_4_ < OVar4;
                  src_block._4_4_ = src_block._4_4_ + 1) {
                *_k_2 = *dest_ptr_2;
                _k_2 = _k_2 + buf_line_stride;
                dest_ptr_2 = dest_ptr_2 + uVar1;
              }
            }
            else if ((OVar4 == 1) && (buf_col_stride == 2)) {
              for (k_3 = 0; k_3 < (OVar6 & 0xfffffffc); k_3 = k_3 + 4) {
                _k_2[k_3 * 2] = dest_ptr_2[k_3];
                _k_2[(k_3 + 1) * 2] = dest_ptr_2[k_3 + 1];
                _k_2[(k_3 + 2) * 2] = dest_ptr_2[k_3 + 2];
                _k_2[(k_3 + 3) * 2] = dest_ptr_2[k_3 + 3];
              }
              for (; k_3 < OVar6; k_3 = k_3 + 1) {
                _k_2[k_3 * 2] = dest_ptr_2[k_3];
              }
            }
            else if ((OVar6 < 8) || (buf_col_stride != 8)) {
              for (src_block._4_4_ = 0; src_block._4_4_ < OVar4;
                  src_block._4_4_ = src_block._4_4_ + 1) {
                for (dest_ptr_4._4_4_ = 0; dest_ptr_4._4_4_ < OVar6;
                    dest_ptr_4._4_4_ = dest_ptr_4._4_4_ + 1) {
                  _k_2[dest_ptr_4._4_4_ * buf_col_stride] = dest_ptr_2[dest_ptr_4._4_4_];
                }
                _k_2 = _k_2 + buf_line_stride;
                dest_ptr_2 = dest_ptr_2 + uVar1;
              }
            }
            else {
              for (src_block._4_4_ = 0; src_block._4_4_ < OVar4;
                  src_block._4_4_ = src_block._4_4_ + 1) {
                for (local_98 = 0; local_98 < (OVar6 & 0xfffffffc); local_98 = local_98 + 4) {
                  _k_2[local_98 * 8] = dest_ptr_2[local_98];
                  _k_2[(local_98 + 1) * 8] = dest_ptr_2[local_98 + 1];
                  _k_2[(local_98 + 2) * 8] = dest_ptr_2[local_98 + 2];
                  _k_2[(local_98 + 3) * 8] = dest_ptr_2[local_98 + 3];
                }
                for (; local_98 < OVar6; local_98 = local_98 + 1) {
                  _k_2[local_98 * 8] = dest_ptr_2[local_98];
                }
                _k_2 = _k_2 + buf_line_stride;
                dest_ptr_2 = dest_ptr_2 + uVar1;
              }
            }
          }
        }
        block_y_offset = block_y_offset + 1;
      }
      block_width = block_width + 1;
    }
    sa_local._4_4_ = 1;
  }
  return sa_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_sparse_array_int32_read_or_write(
    const opj_sparse_array_int32_t* sa,
    OPJ_UINT32 x0,
    OPJ_UINT32 y0,
    OPJ_UINT32 x1,
    OPJ_UINT32 y1,
    OPJ_INT32* buf,
    OPJ_UINT32 buf_col_stride,
    OPJ_UINT32 buf_line_stride,
    OPJ_BOOL forgiving,
    OPJ_BOOL is_read_op)
{
    OPJ_UINT32 y, block_y;
    OPJ_UINT32 y_incr = 0;
    const OPJ_UINT32 block_width = sa->block_width;

    if (!opj_sparse_array_is_region_valid(sa, x0, y0, x1, y1)) {
        return forgiving;
    }

    block_y = y0 / sa->block_height;
    for (y = y0; y < y1; block_y ++, y += y_incr) {
        OPJ_UINT32 x, block_x;
        OPJ_UINT32 x_incr = 0;
        OPJ_UINT32 block_y_offset;
        y_incr = (y == y0) ? sa->block_height - (y0 % sa->block_height) :
                 sa->block_height;
        block_y_offset = sa->block_height - y_incr;
        y_incr = opj_uint_min(y_incr, y1 - y);
        block_x = x0 / block_width;
        for (x = x0; x < x1; block_x ++, x += x_incr) {
            OPJ_UINT32 j;
            OPJ_UINT32 block_x_offset;
            OPJ_INT32* src_block;
            x_incr = (x == x0) ? block_width - (x0 % block_width) : block_width;
            block_x_offset = block_width - x_incr;
            x_incr = opj_uint_min(x_incr, x1 - x);
            src_block = sa->data_blocks[block_y * sa->block_count_hor + block_x];
            if (is_read_op) {
                if (src_block == NULL) {
                    if (buf_col_stride == 1) {
                        OPJ_INT32* dest_ptr = buf + (y - y0) * (OPJ_SIZE_T)buf_line_stride +
                                              (x - x0) * buf_col_stride;
                        for (j = 0; j < y_incr; j++) {
                            memset(dest_ptr, 0, sizeof(OPJ_INT32) * x_incr);
                            dest_ptr += buf_line_stride;
                        }
                    } else {
                        OPJ_INT32* dest_ptr = buf + (y - y0) * (OPJ_SIZE_T)buf_line_stride +
                                              (x - x0) * buf_col_stride;
                        for (j = 0; j < y_incr; j++) {
                            OPJ_UINT32 k;
                            for (k = 0; k < x_incr; k++) {
                                dest_ptr[k * buf_col_stride] = 0;
                            }
                            dest_ptr += buf_line_stride;
                        }
                    }
                } else {
                    const OPJ_INT32* OPJ_RESTRICT src_ptr = src_block + block_y_offset *
                                                            (OPJ_SIZE_T)block_width + block_x_offset;
                    if (buf_col_stride == 1) {
                        OPJ_INT32* OPJ_RESTRICT dest_ptr = buf + (y - y0) * (OPJ_SIZE_T)buf_line_stride
                                                           +
                                                           (x - x0) * buf_col_stride;
                        if (x_incr == 4) {
                            /* Same code as general branch, but the compiler */
                            /* can have an efficient memcpy() */
                            (void)(x_incr); /* trick to silent cppcheck duplicateBranch warning */
                            for (j = 0; j < y_incr; j++) {
                                memcpy(dest_ptr, src_ptr, sizeof(OPJ_INT32) * x_incr);
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        } else {
                            for (j = 0; j < y_incr; j++) {
                                memcpy(dest_ptr, src_ptr, sizeof(OPJ_INT32) * x_incr);
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        }
                    } else {
                        OPJ_INT32* OPJ_RESTRICT dest_ptr = buf + (y - y0) * (OPJ_SIZE_T)buf_line_stride
                                                           +
                                                           (x - x0) * buf_col_stride;
                        if (x_incr == 1) {
                            for (j = 0; j < y_incr; j++) {
                                *dest_ptr = *src_ptr;
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        } else if (y_incr == 1 && buf_col_stride == 2) {
                            OPJ_UINT32 k;
                            for (k = 0; k < (x_incr & ~3U); k += 4) {
                                dest_ptr[k * buf_col_stride] = src_ptr[k];
                                dest_ptr[(k + 1) * buf_col_stride] = src_ptr[k + 1];
                                dest_ptr[(k + 2) * buf_col_stride] = src_ptr[k + 2];
                                dest_ptr[(k + 3) * buf_col_stride] = src_ptr[k + 3];
                            }
                            for (; k < x_incr; k++) {
                                dest_ptr[k * buf_col_stride] = src_ptr[k];
                            }
                        } else if (x_incr >= 8 && buf_col_stride == 8) {
                            for (j = 0; j < y_incr; j++) {
                                OPJ_UINT32 k;
                                for (k = 0; k < (x_incr & ~3U); k += 4) {
                                    dest_ptr[k * buf_col_stride] = src_ptr[k];
                                    dest_ptr[(k + 1) * buf_col_stride] = src_ptr[k + 1];
                                    dest_ptr[(k + 2) * buf_col_stride] = src_ptr[k + 2];
                                    dest_ptr[(k + 3) * buf_col_stride] = src_ptr[k + 3];
                                }
                                for (; k < x_incr; k++) {
                                    dest_ptr[k * buf_col_stride] = src_ptr[k];
                                }
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        } else {
                            /* General case */
                            for (j = 0; j < y_incr; j++) {
                                OPJ_UINT32 k;
                                for (k = 0; k < x_incr; k++) {
                                    dest_ptr[k * buf_col_stride] = src_ptr[k];
                                }
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        }
                    }
                }
            } else {
                if (src_block == NULL) {
                    src_block = (OPJ_INT32*) opj_calloc(1,
                                                        sa->block_width * sa->block_height * sizeof(OPJ_INT32));
                    if (src_block == NULL) {
                        return OPJ_FALSE;
                    }
                    sa->data_blocks[block_y * sa->block_count_hor + block_x] = src_block;
                }

                if (buf_col_stride == 1) {
                    OPJ_INT32* OPJ_RESTRICT dest_ptr = src_block + block_y_offset *
                                                       (OPJ_SIZE_T)block_width + block_x_offset;
                    const OPJ_INT32* OPJ_RESTRICT src_ptr = buf + (y - y0) *
                                                            (OPJ_SIZE_T)buf_line_stride + (x - x0) * buf_col_stride;
                    if (x_incr == 4) {
                        /* Same code as general branch, but the compiler */
                        /* can have an efficient memcpy() */
                        (void)(x_incr); /* trick to silent cppcheck duplicateBranch warning */
                        for (j = 0; j < y_incr; j++) {
                            memcpy(dest_ptr, src_ptr, sizeof(OPJ_INT32) * x_incr);
                            dest_ptr += block_width;
                            src_ptr += buf_line_stride;
                        }
                    } else {
                        for (j = 0; j < y_incr; j++) {
                            memcpy(dest_ptr, src_ptr, sizeof(OPJ_INT32) * x_incr);
                            dest_ptr += block_width;
                            src_ptr += buf_line_stride;
                        }
                    }
                } else {
                    OPJ_INT32* OPJ_RESTRICT dest_ptr = src_block + block_y_offset *
                                                       (OPJ_SIZE_T)block_width + block_x_offset;
                    const OPJ_INT32* OPJ_RESTRICT src_ptr = buf + (y - y0) *
                                                            (OPJ_SIZE_T)buf_line_stride + (x - x0) * buf_col_stride;
                    if (x_incr == 1) {
                        for (j = 0; j < y_incr; j++) {
                            *dest_ptr = *src_ptr;
                            src_ptr += buf_line_stride;
                            dest_ptr += block_width;
                        }
                    } else if (x_incr >= 8 && buf_col_stride == 8) {
                        for (j = 0; j < y_incr; j++) {
                            OPJ_UINT32 k;
                            for (k = 0; k < (x_incr & ~3U); k += 4) {
                                dest_ptr[k] = src_ptr[k * buf_col_stride];
                                dest_ptr[k + 1] = src_ptr[(k + 1) * buf_col_stride];
                                dest_ptr[k + 2] = src_ptr[(k + 2) * buf_col_stride];
                                dest_ptr[k + 3] = src_ptr[(k + 3) * buf_col_stride];
                            }
                            for (; k < x_incr; k++) {
                                dest_ptr[k] = src_ptr[k * buf_col_stride];
                            }
                            src_ptr += buf_line_stride;
                            dest_ptr += block_width;
                        }
                    } else {
                        /* General case */
                        for (j = 0; j < y_incr; j++) {
                            OPJ_UINT32 k;
                            for (k = 0; k < x_incr; k++) {
                                dest_ptr[k] = src_ptr[k * buf_col_stride];
                            }
                            src_ptr += buf_line_stride;
                            dest_ptr += block_width;
                        }
                    }
                }
            }
        }
    }

    return OPJ_TRUE;
}